

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rendsig.c
# Opt level: O0

int32 duh_sigrenderer_generate_samples
                (DUH_SIGRENDERER *sigrenderer,double volume,double delta,int32 size,
                sample_t_conflict **samples)

{
  long lVar1;
  undefined8 in_RDX;
  undefined4 in_ESI;
  long *in_RDI;
  undefined8 in_XMM0_Qa;
  double in_XMM1_Qa;
  longlong t;
  int32 rendered;
  int local_4;
  
  if (in_RDI == (long *)0x0) {
    local_4 = 0;
  }
  else {
    local_4 = (**(code **)(*in_RDI + 0x20))(in_XMM0_Qa,in_XMM1_Qa,in_RDI[1],in_ESI,in_RDX);
    if (local_4 != 0) {
      if (in_RDI[4] != 0) {
        (*(code *)in_RDI[4])(in_RDI[5],in_RDX,(int)in_RDI[2],local_4);
      }
      lVar1 = (long)(int)in_RDI[3] + (long)(in_XMM1_Qa * 65536.0 + 0.5) * (long)local_4;
      *(int *)((long)in_RDI + 0x14) = (int)((ulong)lVar1 >> 0x10) + *(int *)((long)in_RDI + 0x14);
      *(uint *)(in_RDI + 3) = (uint)lVar1 & 0xffff;
    }
  }
  return local_4;
}

Assistant:

int32 DUMBEXPORT duh_sigrenderer_generate_samples(
	DUH_SIGRENDERER *sigrenderer,
	double volume, double delta,
	int32 size, sample_t **samples
)
{
	int32 rendered;
	LONG_LONG t;

	if (!sigrenderer) return 0;

	rendered = (*sigrenderer->desc->sigrenderer_generate_samples)
				(sigrenderer->sigrenderer, volume, delta, size, samples);

	if (rendered) {
		if (sigrenderer->callback)
			(*sigrenderer->callback)(sigrenderer->callback_data,
				(const sample_t *const *)samples, sigrenderer->n_channels, rendered);

		t = sigrenderer->subpos + (LONG_LONG)(delta * 65536.0 + 0.5) * rendered;

		sigrenderer->pos += (int32)(t >> 16);
		sigrenderer->subpos = (int)t & 65535;
	}

	return rendered;
}